

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

void __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::add_to_nonfull(basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                 *this,db_leaf_unique_ptr *child,tree_depth_type depth,uint8_t children_count_)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  byte bVar5;
  uchar uVar6;
  bool bVar7;
  value_type vVar8;
  int iVar9;
  pointer pbVar10;
  reference peVar11;
  in_critical_section *this_00;
  reference pvVar12;
  reference this_01;
  byte in_CL;
  unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  *in_RSI;
  long in_RDI;
  uint j;
  uint64_t cmp_mask;
  __m256i vec_cmp;
  __m256i interleaved_vec_cmp;
  __m256i vec23_cmp;
  __m256i vec01_cmp;
  __m256i doubly_interleaved_vec_cmp;
  __m256i interleaved_vec23_cmp;
  __m256i interleaved_vec01_cmp;
  __m256i vec3_cmp;
  __m256i vec2_cmp;
  __m256i vec1_cmp;
  __m256i vec0_cmp;
  __m256i ptr_vec3;
  __m256i ptr_vec2;
  __m256i ptr_vec1;
  __m256i ptr_vec0;
  __m256i nullptr_vector;
  uint i;
  uint8_t key_byte;
  basic_node_ptr<unodb::detail::olc_node_header> local_538;
  uint local_52c;
  unsigned_long local_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  long local_440;
  long lStack_438;
  long lStack_430;
  long lStack_428;
  long local_420;
  long lStack_418;
  long lStack_410;
  long lStack_408;
  long local_400;
  long lStack_3f8;
  long lStack_3f0;
  long lStack_3e8;
  long local_3e0;
  long lStack_3d8;
  long lStack_3d0;
  long lStack_3c8;
  long local_3c0;
  long lStack_3b8;
  long lStack_3b0;
  long lStack_3a8;
  long local_3a0;
  long lStack_398;
  long lStack_390;
  long lStack_388;
  long local_380;
  long lStack_378;
  long lStack_370;
  long lStack_368;
  long local_360;
  long lStack_358;
  long lStack_350;
  long lStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  uint local_314;
  key_view local_310;
  element_type local_2fa;
  byte local_2f9;
  unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  *local_2f8;
  tree_depth local_2e4 [4];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  long *local_2c0;
  long *local_2b8;
  long *local_2b0;
  long *local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  long local_280;
  long lStack_278;
  long lStack_270;
  long lStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  long local_240;
  long lStack_238;
  long lStack_230;
  long lStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  long local_200;
  long lStack_1f8;
  long lStack_1f0;
  long lStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  long local_1c0;
  long lStack_1b8;
  long lStack_1b0;
  long lStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  long local_120;
  long lStack_118;
  long lStack_110;
  long lStack_108;
  long local_100;
  long lStack_f8;
  long lStack_f0;
  long lStack_e8;
  long local_e0;
  long lStack_d8;
  long lStack_d0;
  long lStack_c8;
  long local_c0;
  long lStack_b8;
  long lStack_b0;
  long lStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_2f9 = in_CL;
  local_2f8 = in_RSI;
  bVar5 = in_critical_section::operator_cast_to_unsigned_char
                    ((in_critical_section *)(in_RDI + 0x20));
  if (bVar5 != local_2f9) {
    __assert_fail("this->children_count == children_count_",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x896,
                  "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  if (local_2f9 < 0x11) {
    __assert_fail("children_count_ >= parent_class::min_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x897,
                  "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  if (0x2f < local_2f9) {
    __assert_fail("children_count_ < parent_class::capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x898,
                  "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  pbVar10 = std::
            unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            ::operator->(local_2f8);
  local_310 = basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
              ::get_key_view(pbVar10);
  vVar8 = tree_depth::operator_cast_to_unsigned_int(local_2e4);
  peVar11 = std::span<const_std::byte,_18446744073709551615UL>::operator[](&local_310,(ulong)vVar8);
  local_2fa = *peVar11;
  this_00 = (in_critical_section *)
            std::array<unodb::in_critical_section<unsigned_char>,_256UL>::operator[]
                      ((array<unodb::in_critical_section<unsigned_char>,_256UL> *)(in_RDI + 0x21),
                       (ulong)local_2fa);
  uVar6 = in_critical_section::operator_cast_to_unsigned_char(this_00);
  if (uVar6 == 0xff) {
    local_314 = 0;
    local_2e0 = 0;
    uStack_2d8 = 0;
    uStack_2d0 = 0;
    uStack_2c8 = 0;
    local_340 = 0;
    uStack_338 = 0;
    uStack_330 = 0;
    uStack_328 = 0;
    while( true ) {
      local_2a8 = (long *)(in_RDI + 0x140 + (ulong)local_314 * 0x20);
      local_360 = *local_2a8;
      lStack_358 = local_2a8[1];
      lStack_350 = local_2a8[2];
      lStack_348 = local_2a8[3];
      local_2b0 = (long *)(in_RDI + 0x140 + (ulong)(local_314 + 1) * 0x20);
      local_380 = *local_2b0;
      lStack_378 = local_2b0[1];
      lStack_370 = local_2b0[2];
      lStack_368 = local_2b0[3];
      local_2b8 = (long *)(in_RDI + 0x140 + (ulong)(local_314 + 2) * 0x20);
      local_3a0 = *local_2b8;
      lStack_398 = local_2b8[1];
      lStack_390 = local_2b8[2];
      lStack_388 = local_2b8[3];
      local_2c0 = (long *)(in_RDI + 0x140 + (ulong)(local_314 + 3) * 0x20);
      local_3c0 = *local_2c0;
      lStack_3b8 = local_2c0[1];
      lStack_3b0 = local_2c0[2];
      lStack_3a8 = local_2c0[3];
      local_1e0 = 0;
      uStack_1d8 = 0;
      uStack_1d0 = 0;
      uStack_1c8 = 0;
      local_3e0 = -(ulong)(local_360 == 0);
      lStack_3d8 = -(ulong)(lStack_358 == 0);
      lStack_3d0 = -(ulong)(lStack_350 == 0);
      lStack_3c8 = -(ulong)(lStack_348 == 0);
      local_220 = 0;
      uStack_218 = 0;
      uStack_210 = 0;
      uStack_208 = 0;
      local_400 = -(ulong)(local_380 == 0);
      lStack_3f8 = -(ulong)(lStack_378 == 0);
      lStack_3f0 = -(ulong)(lStack_370 == 0);
      lStack_3e8 = -(ulong)(lStack_368 == 0);
      local_260 = 0;
      uStack_258 = 0;
      uStack_250 = 0;
      uStack_248 = 0;
      local_420 = -(ulong)(local_3a0 == 0);
      lStack_418 = -(ulong)(lStack_398 == 0);
      lStack_410 = -(ulong)(lStack_390 == 0);
      lStack_408 = -(ulong)(lStack_388 == 0);
      local_2a0 = 0;
      uStack_298 = 0;
      uStack_290 = 0;
      uStack_288 = 0;
      local_440 = -(ulong)(local_3c0 == 0);
      lStack_438 = -(ulong)(lStack_3b8 == 0);
      lStack_430 = -(ulong)(lStack_3b0 == 0);
      lStack_428 = -(ulong)(lStack_3a8 == 0);
      auVar4._8_8_ = lStack_3d8;
      auVar4._0_8_ = local_3e0;
      auVar4._16_8_ = lStack_3d0;
      auVar4._24_8_ = lStack_3c8;
      auVar3._8_8_ = lStack_3f8;
      auVar3._0_8_ = local_400;
      auVar3._16_8_ = lStack_3f0;
      auVar3._24_8_ = lStack_3e8;
      local_460 = vpackssdw_avx2(auVar4,auVar3);
      auVar2._8_8_ = lStack_418;
      auVar2._0_8_ = local_420;
      auVar2._16_8_ = lStack_410;
      auVar2._24_8_ = lStack_408;
      auVar1._8_8_ = lStack_438;
      auVar1._0_8_ = local_440;
      auVar1._16_8_ = lStack_430;
      auVar1._24_8_ = lStack_428;
      local_480 = vpackssdw_avx2(auVar2,auVar1);
      local_140 = local_460._0_8_;
      uStack_138 = local_460._8_8_;
      uStack_130 = local_460._16_8_;
      uStack_128 = local_460._24_8_;
      local_160 = local_480._0_8_;
      uStack_158 = local_480._8_8_;
      uStack_150 = local_480._16_8_;
      uStack_148 = local_480._24_8_;
      local_4a0 = vpackssdw_avx2(local_460,local_480);
      local_80 = local_4a0._0_8_;
      uStack_78 = local_4a0._8_8_;
      uStack_70 = local_4a0._16_8_;
      uStack_68 = local_4a0._24_8_;
      local_a0 = local_4a0._0_8_;
      uStack_98 = local_4a0._8_8_;
      uStack_90 = local_4a0._16_8_;
      uStack_88 = local_4a0._24_8_;
      if (local_4a0 != (undefined1  [32])0x0) break;
      local_314 = local_314 + 4;
    }
    local_4c0 = vpermq_avx2(local_460,0xd8);
    local_4e0 = vpermq_avx2(local_480,0xd8);
    local_180 = local_4c0._0_8_;
    uStack_178 = local_4c0._8_8_;
    uStack_170 = local_4c0._16_8_;
    uStack_168 = local_4c0._24_8_;
    local_1a0 = local_4e0._0_8_;
    uStack_198 = local_4e0._8_8_;
    uStack_190 = local_4e0._16_8_;
    uStack_188 = local_4e0._24_8_;
    local_500 = vpackssdw_avx2(local_4c0,local_4e0);
    local_520 = vpermq_avx2(local_500,0xd8);
    local_60 = local_520._0_8_;
    uStack_58 = local_520._8_8_;
    uStack_50 = local_520._16_8_;
    uStack_48 = local_520._24_8_;
    local_528 = (unsigned_long)
                (int)((uint)(SUB321(local_520 >> 7,0) & 1) |
                      (uint)(SUB321(local_520 >> 0xf,0) & 1) << 1 |
                      (uint)(SUB321(local_520 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(local_520 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(local_520 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(local_520 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(local_520 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(local_520 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(local_520 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(local_520 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(local_520 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(local_520 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(local_520 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(local_520 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(local_520 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(local_520 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(local_520 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(local_520 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(local_520 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(local_520 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(local_520 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(local_520 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(local_520 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(local_520 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(local_520 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(local_520 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(local_520 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(local_520 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(local_520 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(local_520 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(local_520 >> 0xf7,0) & 1) << 0x1e |
                     (uint)(byte)(local_520[0x1f] >> 7) << 0x1f);
    iVar9 = local_314 * 4;
    local_280 = local_3c0;
    lStack_278 = lStack_3b8;
    lStack_270 = lStack_3b0;
    lStack_268 = lStack_3a8;
    local_240 = local_3a0;
    lStack_238 = lStack_398;
    lStack_230 = lStack_390;
    lStack_228 = lStack_388;
    local_200 = local_380;
    lStack_1f8 = lStack_378;
    lStack_1f0 = lStack_370;
    lStack_1e8 = lStack_368;
    local_1c0 = local_360;
    lStack_1b8 = lStack_358;
    lStack_1b0 = lStack_350;
    lStack_1a8 = lStack_348;
    local_120 = local_440;
    lStack_118 = lStack_438;
    lStack_110 = lStack_430;
    lStack_108 = lStack_428;
    local_100 = local_420;
    lStack_f8 = lStack_418;
    lStack_f0 = lStack_410;
    lStack_e8 = lStack_408;
    local_e0 = local_400;
    lStack_d8 = lStack_3f8;
    lStack_d0 = lStack_3f0;
    lStack_c8 = lStack_3e8;
    local_c0 = local_3e0;
    lStack_b8 = lStack_3d8;
    lStack_b0 = lStack_3d0;
    lStack_a8 = lStack_3c8;
    bVar5 = ctz<unsigned_long>(local_528);
    local_314 = iVar9 + ((int)(uint)bVar5 >> 1);
    if (local_314 < 0x30) {
      pvVar12 = std::
                array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_48UL>
                ::operator[]((array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_48UL>
                              *)(in_RDI + 0x140),(ulong)local_314);
      bVar7 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::
              operator==(pvVar12,(nullptr_t)0x0);
      if (!bVar7) {
        __assert_fail("children.pointer_array[i] == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x903,
                      "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                     );
      }
      local_52c = 0;
      while( true ) {
        if (local_314 <= local_52c) {
          uVar6 = (uchar)local_314;
          this_01 = std::array<unodb::in_critical_section<unsigned_char>,_256UL>::operator[]
                              ((array<unodb::in_critical_section<unsigned_char>,_256UL> *)
                               (in_RDI + 0x21),(ulong)local_2fa);
          in_critical_section<unsigned_char>::operator=(this_01,uVar6);
          pbVar10 = std::
                    unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    ::release(local_2f8);
          basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr
                    (&local_538,&pbVar10->super_olc_node_header,LEAF);
          pvVar12 = std::
                    array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_48UL>
                    ::operator[]((array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_48UL>
                                  *)(in_RDI + 0x140),(ulong)local_314);
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::
          operator=(pvVar12,local_538);
          in_critical_section<unsigned_char>::operator=
                    ((in_critical_section<unsigned_char> *)(in_RDI + 0x20),local_2f9 + 1);
          return;
        }
        pvVar12 = std::
                  array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_48UL>
                  ::operator[]((array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_48UL>
                                *)(in_RDI + 0x140),(ulong)local_52c);
        bVar7 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                ::operator==(pvVar12,(nullptr_t)0x0);
        if (((bVar7 ^ 0xffU) & 1) == 0) break;
        local_52c = local_52c + 1;
      }
      __assert_fail("children.pointer_array[j] != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0x905,
                    "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                   );
    }
    __assert_fail("i < parent_class::capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x900,
                  "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  __assert_fail("child_indexes[key_byte] == empty_child",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x89b,
                "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
               );
}

Assistant:

constexpr void add_to_nonfull(db_leaf_unique_ptr &&child,
                                tree_depth_type depth,
                                std::uint8_t children_count_) noexcept {
    UNODB_DETAIL_ASSERT(this->children_count == children_count_);
    UNODB_DETAIL_ASSERT(children_count_ >= parent_class::min_size);
    UNODB_DETAIL_ASSERT(children_count_ < parent_class::capacity);

    const auto key_byte = static_cast<uint8_t>(child->get_key_view()[depth]);
    UNODB_DETAIL_ASSERT(child_indexes[key_byte] == empty_child);
    unsigned i{0};
#ifdef UNODB_DETAIL_SSE4_2
    const auto nullptr_vector = _mm_setzero_si128();
    while (true) {
      const auto ptr_vec0 = _mm_load_si128(&children.pointer_vector[i]);
      const auto ptr_vec1 = _mm_load_si128(&children.pointer_vector[i + 1]);
      const auto ptr_vec2 = _mm_load_si128(&children.pointer_vector[i + 2]);
      const auto ptr_vec3 = _mm_load_si128(&children.pointer_vector[i + 3]);
      const auto vec0_cmp = _mm_cmpeq_epi64(ptr_vec0, nullptr_vector);
      const auto vec1_cmp = _mm_cmpeq_epi64(ptr_vec1, nullptr_vector);
      const auto vec2_cmp = _mm_cmpeq_epi64(ptr_vec2, nullptr_vector);
      const auto vec3_cmp = _mm_cmpeq_epi64(ptr_vec3, nullptr_vector);
      // OK to treat 64-bit comparison result as 32-bit vector: we need to find
      // the first 0xFF only.
      const auto vec01_cmp = _mm_packs_epi32(vec0_cmp, vec1_cmp);
      const auto vec23_cmp = _mm_packs_epi32(vec2_cmp, vec3_cmp);
      const auto vec_cmp = _mm_packs_epi32(vec01_cmp, vec23_cmp);
      const auto cmp_mask =
          static_cast<std::uint64_t>(_mm_movemask_epi8(vec_cmp));
      if (cmp_mask != 0) {
        i = (i << 1U) + (((detail::ctz(cmp_mask)) + 1U) >> 1U);
        break;
      }
      i += 4;
    }
#elif defined(UNODB_DETAIL_AVX2)
    const auto nullptr_vector = _mm256_setzero_si256();
    while (true) {
      const auto ptr_vec0 = _mm256_load_si256(&children.pointer_vector[i]);
      const auto ptr_vec1 = _mm256_load_si256(&children.pointer_vector[i + 1]);
      const auto ptr_vec2 = _mm256_load_si256(&children.pointer_vector[i + 2]);
      const auto ptr_vec3 = _mm256_load_si256(&children.pointer_vector[i + 3]);
      const auto vec0_cmp = _mm256_cmpeq_epi64(ptr_vec0, nullptr_vector);
      const auto vec1_cmp = _mm256_cmpeq_epi64(ptr_vec1, nullptr_vector);
      const auto vec2_cmp = _mm256_cmpeq_epi64(ptr_vec2, nullptr_vector);
      const auto vec3_cmp = _mm256_cmpeq_epi64(ptr_vec3, nullptr_vector);
      const auto interleaved_vec01_cmp = _mm256_packs_epi32(vec0_cmp, vec1_cmp);
      const auto interleaved_vec23_cmp = _mm256_packs_epi32(vec2_cmp, vec3_cmp);
      const auto doubly_interleaved_vec_cmp =
          _mm256_packs_epi32(interleaved_vec01_cmp, interleaved_vec23_cmp);
      if (!_mm256_testz_si256(doubly_interleaved_vec_cmp,
                              doubly_interleaved_vec_cmp)) {
        const auto vec01_cmp =
            _mm256_permute4x64_epi64(interleaved_vec01_cmp, 0b11'01'10'00);
        const auto vec23_cmp =
            _mm256_permute4x64_epi64(interleaved_vec23_cmp, 0b11'01'10'00);
        const auto interleaved_vec_cmp =
            _mm256_packs_epi32(vec01_cmp, vec23_cmp);
        const auto vec_cmp =
            _mm256_permute4x64_epi64(interleaved_vec_cmp, 0b11'01'10'00);
        const auto cmp_mask =
            static_cast<std::uint64_t>(_mm256_movemask_epi8(vec_cmp));
        i = (i << 2U) + (detail::ctz(cmp_mask) >> 1U);
        break;
      }
      i += 4;
    }
#elif defined(__aarch64__)
    const auto nullptr_vector = vdupq_n_u64(0);
    while (true) {
      const auto ptr_vec0 = children.pointer_vector[i];
      const auto ptr_vec1 = children.pointer_vector[i + 1];
      const auto ptr_vec2 = children.pointer_vector[i + 2];
      const auto ptr_vec3 = children.pointer_vector[i + 3];
      const auto vec0_cmp = vceqq_u64(nullptr_vector, ptr_vec0);
      const auto vec1_cmp = vceqq_u64(nullptr_vector, ptr_vec1);
      const auto vec2_cmp = vceqq_u64(nullptr_vector, ptr_vec2);
      const auto vec3_cmp = vceqq_u64(nullptr_vector, ptr_vec3);
      const auto narrowed_cmp0 = vshrn_n_u64(vec0_cmp, 4);
      const auto narrowed_cmp1 = vshrn_n_u64(vec1_cmp, 4);
      const auto narrowed_cmp2 = vshrn_n_u64(vec2_cmp, 4);
      const auto narrowed_cmp3 = vshrn_n_u64(vec3_cmp, 4);
      const auto cmp01 = vcombine_u32(narrowed_cmp0, narrowed_cmp1);
      const auto cmp23 = vcombine_u32(narrowed_cmp2, narrowed_cmp3);
      // NOLINTNEXTLINE(misc-const-correctness)
      const auto narrowed_cmp01 = vshrn_n_u32(cmp01, 4);
      // NOLINTNEXTLINE(misc-const-correctness)
      const auto narrowed_cmp23 = vshrn_n_u32(cmp23, 4);
      const auto cmp = vcombine_u16(narrowed_cmp01, narrowed_cmp23);
      // NOLINTNEXTLINE(misc-const-correctness)
      const auto narrowed_cmp = vshrn_n_u16(cmp, 4);
      const auto scalar_pos =
          // NOLINTNEXTLINE(misc-const-correctness)
          vget_lane_u64(vreinterpret_u64_u8(narrowed_cmp), 0);
      if (scalar_pos != 0) {
        i = (i << 1U) + static_cast<unsigned>(detail::ctz(scalar_pos) >> 3U);
        break;
      }
      i += 4;
    }
#else   // #ifdef UNODB_DETAIL_X86_64
    node_ptr child_ptr;
    while (true) {
      child_ptr = children.pointer_array[i];
      if (child_ptr == nullptr) break;
      UNODB_DETAIL_ASSERT(i < 255);
      ++i;
    }
#endif  // #ifdef UNODB_DETAIL_X86_64

    UNODB_DETAIL_ASSUME(i < parent_class::capacity);

#ifndef NDEBUG
    UNODB_DETAIL_ASSERT(children.pointer_array[i] == nullptr);
    for (unsigned j = 0; j < i; ++j)
      UNODB_DETAIL_ASSERT(children.pointer_array[j] != nullptr);
#endif

    child_indexes[key_byte] = static_cast<std::uint8_t>(i);
    children.pointer_array[i] = node_ptr{child.release(), node_type::LEAF};
    this->children_count = children_count_ + 1U;
  }